

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t
scatter(ion_bpp_handle_t handle,ion_bpp_buffer_t *pbuf,ion_bpp_key_t *pkey,int is,
       ion_bpp_buffer_t **tmp)

{
  ion_bpp_buffer_t **b;
  long lVar1;
  ion_bpp_buffer_t *piVar2;
  ion_bpp_buffer_t *piVar3;
  ion_bpp_node_t *piVar4;
  ion_bpp_node_t *piVar5;
  uint uVar6;
  ion_bpp_err_t iVar7;
  ushort *puVar8;
  ion_bpp_address_t iVar9;
  ushort uVar10;
  short sVar11;
  int *piVar12;
  uint uVar13;
  ushort *__src;
  int iVar14;
  ion_bpp_key_t *__src_00;
  ulong uVar15;
  ion_bpp_key_t *__dest;
  bool bVar16;
  ion_bpp_h_node_t *h;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ion_bpp_buffer_t *buf;
  ion_bpp_buffer_t *local_38;
  
  puVar8 = *(ushort **)((long)handle + 0x98);
  __src = puVar8 + 0x10;
  uVar17 = (uint)(*puVar8 >> 1);
  uVar13 = *(uint *)((long)handle + 0xb8);
  iVar14 = (uVar13 >> 1) + 1;
  uVar19 = is;
  iVar18 = (uVar13 + 1 >> 1) + 1;
  uVar6 = uVar13;
  if ((*puVar8 & 1) != 0) {
    iVar18 = iVar14;
    uVar6 = uVar13 - 1;
  }
  while ((uVar19 == 0 || (uVar20 = uVar19 - 1, (int)(uVar20 * uVar6 + (uVar13 - 1)) < (int)uVar17)))
  {
    lVar1 = *(long *)((long)handle + 0xc0);
    *(long *)((long)handle + 0xc0) = *(int *)((long)handle + 0x10) + lVar1;
    b = tmp + (int)uVar19;
    iVar7 = assignBuf(handle,lVar1,b);
    if (iVar7 != bErrOk) {
      return iVar7;
    }
    puVar8 = *(ushort **)((long)handle + 0x98);
    if ((*puVar8 & 1) != 0) {
      if (uVar19 == 0) {
        piVar4 = (*tmp)->p;
        piVar4->prev = 0;
        piVar4->next = 0;
      }
      else {
        piVar2 = b[-1];
        piVar3 = *b;
        piVar4 = piVar3->p;
        piVar4->prev = piVar2->adr;
        piVar5 = piVar2->p;
        piVar4->next = piVar5->next;
        piVar5->next = piVar3->adr;
      }
    }
    uVar20 = uVar19 + 1;
    piVar12 = &nNodesIns;
LAB_001107eb:
    *piVar12 = *piVar12 + 1;
    uVar19 = uVar20;
  }
  if ((int)uVar19 < 2) {
    bVar16 = false;
    sVar11 = (short)((long)(ulong)uVar17 / (long)(int)uVar19);
    if (uVar19 != 1) goto LAB_0011085b;
  }
  else {
    if ((int)uVar17 < (int)(uVar20 * iVar18 + iVar14)) {
      piVar2 = tmp[(ulong)uVar19 - 2];
      if (((*puVar8 & 1) != 0) && (piVar2->adr != 0)) {
        piVar2->p->next = tmp[uVar20]->p->next;
      }
      piVar2->p->next = tmp[uVar20]->p->next;
      piVar12 = &nNodesDel;
      goto LAB_001107eb;
    }
    sVar11 = (short)(uVar17 / uVar19);
  }
  uVar15 = 0;
  uVar21 = (long)(ulong)uVar17 % (long)(int)uVar19 & 0xffffffff;
  do {
    bVar16 = (int)uVar21 != 0 && uVar15 != 0;
    uVar21 = (ulong)((int)uVar21 - (uint)bVar16);
    *(ushort *)tmp[uVar15]->p = (*(ushort *)tmp[uVar15]->p & 1) + ((ushort)bVar16 + sVar11) * 2;
    uVar15 = uVar15 + 1;
  } while (uVar19 != uVar15);
  bVar16 = true;
LAB_0011085b:
  iVar18 = uVar19 - is;
  if (iVar18 != 0) {
    if ((**(byte **)((long)handle + 0x98) & 1) != 0) {
      lVar1 = tmp[(int)uVar20]->p->next;
      if (lVar1 != 0) {
        iVar7 = readDisk(handle,lVar1,&local_38);
        if (iVar7 != bErrOk) {
          return iVar7;
        }
        local_38->p->prev = tmp[(int)uVar20]->adr;
        local_38->valid = boolean_true;
        local_38->modified = boolean_true;
      }
    }
    uVar13 = *(int *)((long)handle + 0xbc) * iVar18;
    iVar14 = ((int)pbuf->p - (int)pkey) + 0x20;
    if ((int)uVar13 < 0) {
      iVar14 = iVar14 + uVar13;
      __src_00 = pkey + -(long)(int)uVar13;
      __dest = pkey;
    }
    else {
      __src_00 = pkey;
      __dest = pkey + uVar13;
    }
    memmove(__dest,__src_00,
            (long)(int)((uint)(*(ushort *)pbuf->p >> 1) * *(int *)((long)handle + 0xbc) + iVar14));
    uVar10 = (ushort)*(undefined4 *)pbuf->p;
    sVar11 = (uVar10 - 2) + (short)iVar18 * 2;
    if (1 < uVar10) {
      sVar11 = uVar10 + (short)iVar18 * 2;
    }
    *(short *)pbuf->p = sVar11;
  }
  if (!bVar16) {
    *(ushort *)pbuf->p = *(ushort *)pbuf->p & 0xfffe;
    pbuf->valid = boolean_true;
    pbuf->modified = boolean_true;
    return bErrOk;
  }
  uVar21 = 0;
  do {
    if ((**(byte **)((long)handle + 0x98) & 1) == 0) {
      if (uVar21 == 0) {
        piVar2 = *tmp;
        piVar2->p->childLT = *(ion_bpp_address_t *)(__src + -4);
        iVar9 = piVar2->adr;
LAB_00110a1a:
        *(ion_bpp_address_t *)(pkey + -8) = iVar9;
      }
      else {
        tmp[uVar21]->p->childLT =
             *(ion_bpp_address_t *)((long)__src + (long)*(int *)((long)handle + 8) + 8);
        memcpy(pkey,__src,(long)*(int *)((long)handle + 0xbc));
        piVar2 = tmp[uVar21];
        *(ion_bpp_address_t *)(pkey + (long)*(int *)((long)handle + 8) + 8) = piVar2->adr;
        __src = (ushort *)((long)__src + (long)*(int *)((long)handle + 0xbc));
        pkey = pkey + *(int *)((long)handle + 0xbc);
        piVar4 = piVar2->p;
        *(short *)piVar4 = *(short *)piVar4 + -2;
      }
    }
    else {
      piVar2 = tmp[uVar21];
      piVar2->p->childLT = 0;
      if (uVar21 == 0) {
        iVar9 = piVar2->adr;
        goto LAB_00110a1a;
      }
      memcpy(pkey,__src,(long)*(int *)((long)handle + 0xbc));
      *(ion_bpp_address_t *)(pkey + (long)*(int *)((long)handle + 8) + 8) = tmp[uVar21]->adr;
      pkey = pkey + *(int *)((long)handle + 0xbc);
    }
    memcpy(&tmp[uVar21]->p->fkey,__src,
           (ulong)(*(ushort *)tmp[uVar21]->p >> 1) * (long)*(int *)((long)handle + 0xbc));
    *(ushort *)tmp[uVar21]->p =
         (ushort)*(undefined4 *)tmp[uVar21]->p & 0xfffe | **(ushort **)((long)handle + 0x98) & 1;
    __src = (ushort *)
            ((long)__src +
            (ulong)(*(ushort *)tmp[uVar21]->p >> 1) * (long)*(int *)((long)handle + 0xbc));
    uVar21 = uVar21 + 1;
    if (uVar19 == uVar21) {
      *(ushort *)pbuf->p = *(ushort *)pbuf->p & 0xfffe;
      pbuf->valid = boolean_true;
      pbuf->modified = boolean_true;
      if (bVar16) {
        uVar21 = 0;
        do {
          piVar2 = tmp[uVar21];
          piVar2->valid = boolean_true;
          piVar2->modified = boolean_true;
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      return bErrOk;
    }
  } while( true );
}

Assistant:

static ion_bpp_err_t
scatter(
	ion_bpp_handle_t	handle,
	ion_bpp_buffer_t	*pbuf,
	ion_bpp_key_t		*pkey,
	int					is,
	ion_bpp_buffer_t	**tmp
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_buffer_t	*gbuf;				/* gather buf */
	ion_bpp_key_t		*gkey;			/* gather buf key */
	ion_bpp_err_t		rc;			/* return code */
	int					iu;		/* number of tmp's used */
	int					k0Min;	/* min #keys that can be mapped to tmp[0] */
	int					knMin;	/* min #keys that can be mapped to tmp[1..3] */
	int					k0Max;	/* max #keys that can be mapped to tmp[0] */
	int					knMax;	/* max #keys that can be mapped to tmp[1..3] */
	int					sw;		/* shift width */
	int					len;	/* length of remainder of buf */
	int					base;	/* base count distributed to tmps */
	int					extra;	/* extra counts */
	int					ct;
	int					i;

	/*
	 * input:
	 *   pbuf				   parent buffer of gathered keys
	 *   pkey				   where we insert a key if needed in parent
	 *   is					 number of supplied tmps
	 *   tmp					array of tmp's to be used for scattering
	 * output:
	 *   tmp					array of tmp's used for scattering
	*/

	/* scatter gbuf to tmps, placing 3/4 max in each tmp */

	gbuf	= &h->gbuf;
	gkey	= fkey(gbuf);
	ct		= ct(gbuf);

	/****************************************
	 * determine number of tmps to use (iu) *
	 ****************************************/
	iu		= is;

	/* determine limits */
	if (leaf(gbuf)) {
		/* minus 1 to allow for insertion */
		k0Max	= h->maxCt - 1;
		knMax	= h->maxCt - 1;
		/* plus 1 to allow for deletion */
		k0Min	= (h->maxCt / 2) + 1;
		knMin	= (h->maxCt / 2) + 1;
	}
	else {
		/* can hold an extra gbuf key as it's translated to a LT pointer */
		k0Max	= h->maxCt - 1;
		knMax	= h->maxCt;
		k0Min	= (h->maxCt / 2) + 1;
		knMin	= ((h->maxCt + 1) / 2) + 1;
	}

	/* calculate iu, number of tmps to use */
	while (1) {
		if ((iu == 0) || (ct > (k0Max + (iu - 1) * knMax))) {
			/* add a buffer */
			if ((rc = assignBuf(handle, allocAdr(handle), &tmp[iu])) != 0) {
				return rc;
			}

			/* update sequential links */
			if (leaf(gbuf)) {
				/* adjust sequential links */
				if (iu == 0) {
					/* no tmps supplied when splitting root for first time */
					prev(tmp[0])	= 0;
					next(tmp[0])	= 0;
				}
				else {
					prev(tmp[iu])		= tmp[iu - 1]->adr;
					next(tmp[iu])		= next(tmp[iu - 1]);
					next(tmp[iu - 1])	= tmp[iu]->adr;
				}
			}

			iu++;
			nNodesIns++;
		}
		else if ((iu > 1) && (ct < (k0Min + (iu - 1) * knMin))) {
			/* del a buffer */
			iu--;

			/* adjust sequential links */
			if (leaf(gbuf) && tmp[iu - 1]->adr) {
				next(tmp[iu - 1]) = next(tmp[iu]);
			}

			next(tmp[iu - 1]) = next(tmp[iu]);
			nNodesDel++;
		}
		else {
			break;
		}
	}

	/* establish count for each tmp used */
	base	= ct / iu;
	extra	= ct % iu;

	for (i = 0; i < iu; i++) {
		int n;

		n = base;

		/* distribute extras, one at a time */
		/* don't do to 1st node, as it may be internal and can't hold it */
		if (i && extra) {
			n++;
			extra--;
		}

		ct(tmp[i]) = n;
	}

	/**************************************
	 * update sequential links and parent *
	 **************************************/
	if (iu != is) {
		/* link last node to next */
		if (leaf(gbuf) && next(tmp[iu - 1])) {
			ion_bpp_buffer_t *buf;

			if ((rc = readDisk(handle, next(tmp[iu - 1]), &buf)) != 0) {
				return rc;
			}

			prev(buf) = tmp[iu - 1]->adr;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}
		}

		/* shift keys in parent */
		sw = ks(iu - is);

		if (sw < 0) {
			len = ks(ct(pbuf)) - (pkey - fkey(pbuf)) + sw;
			memmove(pkey, pkey - sw, len);
		}
		else {
			len = ks(ct(pbuf)) - (pkey - fkey(pbuf));
			memmove(pkey + sw, pkey, len);
		}

		/* don't count LT buffer for empty parent */
		if (ct(pbuf)) {
			ct(pbuf) += iu - is;
		}
		else {
			ct(pbuf) += iu - is - 1;
		}
	}

	/*******************************
	 * distribute keys to children *
	 *******************************/
	for (i = 0; i < iu; i++) {
		/* update LT pointer and parent nodes */
		if (leaf(gbuf)) {
			/* update LT, tmp[i] */
			childLT(fkey(tmp[i])) = 0;

			/* update parent */
			if (i == 0) {
				childLT(pkey) = tmp[i]->adr;
			}
			else {
				memcpy(pkey, gkey, ks(1));
				childGE(pkey)	= tmp[i]->adr;
				pkey			+= ks(1);
			}
		}
		else {
			if (i == 0) {
				/* update LT, tmp[0] */
				childLT(fkey(tmp[i]))	= childLT(gkey);
				/* update LT, parent */
				childLT(pkey)			= tmp[i]->adr;
			}
			else {
				/* update LT, tmp[i] */
				childLT(fkey(tmp[i]))	= childGE(gkey);
				/* update parent key */
				memcpy(pkey, gkey, ks(1));
				childGE(pkey)			= tmp[i]->adr;
				gkey					+= ks(1);
				pkey					+= ks(1);
				ct(tmp[i])--;
			}
		}

		/* install keys, tmp[i] */
		memcpy(fkey(tmp[i]), gkey, ks(ct(tmp[i])));
		leaf(tmp[i])	= leaf(gbuf);

		gkey			+= ks(ct(tmp[i]));
	}

	leaf(pbuf) = boolean_false;

	/************************
	 * write modified nodes *
	 ************************/
	if ((rc = writeDisk(pbuf)) != 0) {
		return rc;
	}

	for (i = 0; i < iu; i++) {
		if ((rc = writeDisk(tmp[i])) != 0) {
			return rc;
		}
	}

	return bErrOk;
}